

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int ws_frame_prep_tx(nni_ws *ws,ws_frame *frame)

{
  nni_aio *aio;
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar4;
  uint8_t *__dest;
  size_t sVar3;
  undefined1 uVar5;
  size_t *psVar6;
  ulong uVar7;
  uint local_44;
  nni_iov *pnStack_40;
  uint niov;
  nni_iov *iov;
  
  aio = frame->aio;
  frame->len = 0;
  iov = (nni_iov *)ws;
  nni_aio_get_iov(aio,&local_44,&stack0xffffffffffffffc0);
  psVar6 = &pnStack_40->iov_len;
  for (uVar7 = 0; uVar7 < local_44; uVar7 = uVar7 + 1) {
    frame->len = frame->len + *psVar6;
    psVar6 = psVar6 + 2;
  }
  uVar7 = iov[0x9f].iov_len;
  uVar5 = true;
  sVar3 = frame->len;
  if (uVar7 != 0 && uVar7 < frame->len) {
    frame->len = uVar7;
    uVar5 = *(undefined1 *)((long)&iov[5].iov_buf + 5);
    sVar3 = uVar7;
  }
  frame->final = (_Bool)uVar5;
  if (frame->asize < sVar3) {
    nni_free(frame->adata,frame->asize);
    __dest = (uint8_t *)nni_alloc(frame->len);
    frame->adata = __dest;
    if (__dest == (uint8_t *)0x0) {
      frame->asize = 0;
      return 2;
    }
    sVar3 = frame->len;
    frame->asize = sVar3;
    frame->buf = __dest;
  }
  else {
    __dest = frame->buf;
  }
  for (; sVar3 != 0; sVar3 = sVar3 - uVar7) {
    uVar7 = pnStack_40->iov_len;
    if (sVar3 < pnStack_40->iov_len) {
      uVar7 = sVar3;
    }
    memcpy(__dest,pnStack_40->iov_buf,uVar7);
    pnStack_40 = pnStack_40 + 1;
    __dest = __dest + uVar7;
  }
  sVar3 = nni_aio_count(aio);
  if (sVar3 == 0) {
    if (*(char *)((long)&iov[5].iov_buf + 7) == '\x01') {
      frame->op = WS_TEXT;
      bVar1 = 1;
    }
    else {
      frame->op = WS_BINARY;
      bVar1 = 2;
    }
  }
  else {
    frame->op = WS_CONT;
    bVar1 = 0;
  }
  frame->head[0] = bVar1;
  frame->hlen = 2;
  if (frame->final == true) {
    frame->head[0] = bVar1 | 0x80;
  }
  uVar7 = frame->len;
  uVar2 = (uint8_t)uVar7;
  if (uVar7 < 0x7e) {
    frame->head[1] = uVar2;
  }
  else {
    uVar4 = (uint8_t)(uVar7 >> 8);
    if (uVar7 < 0x10000) {
      frame->head[1] = '~';
      frame->head[2] = uVar4;
      frame->head[3] = uVar2;
      frame->hlen = 4;
    }
    else {
      frame->head[1] = '\x7f';
      frame->head[2] = (uint8_t)(uVar7 >> 0x38);
      frame->head[3] = (uint8_t)(uVar7 >> 0x30);
      frame->head[4] = (uint8_t)(uVar7 >> 0x28);
      frame->head[5] = (uint8_t)(uVar7 >> 0x20);
      frame->head[6] = (uint8_t)(uVar7 >> 0x18);
      frame->head[7] = (uint8_t)(uVar7 >> 0x10);
      frame->head[8] = uVar4;
      frame->head[9] = uVar2;
      frame->hlen = 10;
    }
  }
  frame->masked = false;
  if (*(char *)&iov[5].iov_buf == '\0') {
    ws_mask_frame(frame);
  }
  return 0;
}

Assistant:

static int
ws_frame_prep_tx(nni_ws *ws, ws_frame *frame)
{
	nng_aio *aio = frame->aio;
	nni_iov *iov;
	unsigned niov;
	size_t   len;
	uint8_t *buf;

	// Figure out how much we need for the entire aio.
	frame->len = 0;
	nni_aio_get_iov(aio, &niov, &iov);
	for (unsigned i = 0; i < niov; i++) {
		frame->len += iov[i].iov_len;
	}

	if ((frame->len > ws->fragsize) && (ws->fragsize > 0)) {
		// Limit it to a single frame per policy (fragsize), as needed.
		frame->len = ws->fragsize;
		// For stream mode, we constrain ourselves to one frame
		// per message. Submitter may see a partial transmit, and
		// should resubmit as needed.  For message mode, we will
		// continue to resubmit.
		frame->final = ws->isstream ? true : false;
	} else {
		// It all fits in this frame (which might not be the first),
		// so we're done.
		frame->final = true;
	}
	// Potentially allocate space for the data if we need to.
	// Note that an empty message is legal.
	if ((frame->asize < frame->len) && (frame->len > 0)) {
		nni_free(frame->adata, frame->asize);
		frame->adata = nni_alloc(frame->len);
		if (frame->adata == NULL) {
			frame->asize = 0;
			return (NNG_ENOMEM);
		}
		frame->asize = frame->len;
		frame->buf   = frame->adata;
	}
	buf = frame->buf;

	// Now copy the data into the frame.
	len = frame->len;
	while (len != 0) {
		size_t n = len;
		if (n > iov->iov_len) {
			n = iov->iov_len;
		}
		memcpy(buf, iov->iov_buf, n);
		iov++;
		len -= n;
		buf += n;
	}

	if (nni_aio_count(aio) == 0) {
		// This is the first frame.
		if (ws->send_text) {
			frame->op = WS_TEXT;
		} else {
			frame->op = WS_BINARY;
		}
	} else {
		frame->op = WS_CONT;
	}

	// Populate the frame header.
	frame->head[0] = frame->op;
	frame->hlen    = 2;
	if (frame->final) {
		frame->head[0] |= 0x80; // final frame bit
	}
	if (frame->len < 126) {
		frame->head[1] = frame->len & 0x7f;
	} else if (frame->len < 65536) {
		frame->head[1] = 126;
		NNI_PUT16(frame->head + 2, (frame->len & 0xffff));
		frame->hlen += 2;
	} else {
		frame->head[1] = 127;
		NNI_PUT64(frame->head + 2, (uint64_t) frame->len);
		frame->hlen += 8;
	}

	// If we are on the client, then we need to mask the frame.
	frame->masked = false;
	if (!ws->server) {
		ws_mask_frame(frame);
	}
	return (0);
}